

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fire.hpp
# Opt level: O0

void __thiscall
fire::_matcher::_matcher
          (_matcher *this,int argc,char **argv,int main_argc,bool space_assignment,bool strict)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_278;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fire::_matcher::arg_type>
  local_1f0;
  optional<int> local_1c8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1bd;
  undefined1 local_1bc;
  allocator<char> local_1bb;
  allocator<char> local_1ba;
  allocator<char> local_1b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190 [32];
  string local_170 [32];
  iterator local_150;
  size_type local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  undefined1 local_128 [8];
  identifier help;
  bool strict_local;
  bool space_assignment_local;
  int main_argc_local;
  char **argv_local;
  int argc_local;
  _matcher *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->_positional);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fire::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fire::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&this->_named);
  std::vector<fire::identifier,_std::allocator<fire::identifier>_>::vector(&this->_queried);
  _first<fire::identifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_first(&this->_deferred_error);
  this->_main_argc = 0;
  this->_space_assignment = false;
  this->_strict = false;
  this->_help_flag = false;
  this->_main_argc = main_argc;
  this->_space_assignment = space_assignment;
  this->_strict = strict;
  parse(this,argc,argv);
  local_1bc = 1;
  local_1b8 = &local_1b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"-h",&local_1b9);
  local_1b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_190,"--help",&local_1ba);
  local_1b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_170,"Print the help message",&local_1bb);
  local_1bc = 0;
  local_150 = &local_1b0;
  local_148 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_1bd);
  __l._M_len = local_148;
  __l._M_array = local_150;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_140,__l,&local_1bd);
  local_1c8._value = 0;
  local_1c8._exists = false;
  local_1c8._5_3_ = 0;
  optional<int>::optional(&local_1c8);
  identifier::identifier((identifier *)local_128,&local_140,local_1c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_140);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_1bd);
  local_278 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_150;
  do {
    local_278 = local_278 + -1;
    std::__cxx11::string::~string((string *)local_278);
  } while (local_278 != &local_1b0);
  std::allocator<char>::~allocator(&local_1bb);
  std::allocator<char>::~allocator(&local_1ba);
  std::allocator<char>::~allocator(&local_1b9);
  get_and_mark_as_queried_abi_cxx11_(&local_1f0,this,(identifier *)local_128);
  this->_help_flag = local_1f0.second != none_t;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fire::_matcher::arg_type>
  ::~pair(&local_1f0);
  check(this,false);
  identifier::~identifier((identifier *)local_128);
  return;
}

Assistant:

_matcher::_matcher(int argc, const char **argv, int main_argc, bool space_assignment, bool strict) {
        _main_argc = main_argc;
        _space_assignment = space_assignment;
        _strict = strict;

        parse(argc, argv);
        identifier help({"-h", "--help", "Print the help message"}, optional<int>());
        _help_flag = get_and_mark_as_queried(help).second != arg_type::none_t;
        check(false);
    }